

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datset.cpp
# Opt level: O0

list<cv::Mat,_std::allocator<cv::Mat>_> *
randomWarps_abi_cxx11_
          (list<cv::Mat,_std::allocator<cv::Mat>_> *__return_storage_ptr__,Mat *plate,int n)

{
  result_type_conflict1 rVar1;
  int in_R8D;
  result_type_conflict2 rVar2;
  result_type_conflict2 rVar3;
  result_type_conflict2 rVar4;
  Mat local_2a68 [96];
  Mat local_2a08 [96];
  _InputArray local_29a8;
  undefined1 local_2990 [112];
  _InputArray local_2920;
  _InputArray local_2908;
  Mat local_28f0 [8];
  Mat res;
  Mat local_2890 [8];
  Mat grey;
  Mat local_2830 [8];
  Mat respl;
  Mat local_27d0 [8];
  Mat platew;
  double zangl;
  double yangl;
  double xangl;
  undefined1 local_2750 [4];
  int i;
  uniform_real_distribution<double> realgen;
  mt19937 gen;
  undefined1 local_13a8 [8];
  random_device rd;
  int n_local;
  Mat *plate_local;
  list<cv::Mat,_std::allocator<cv::Mat>_> *warps;
  
  rd.field_0._M_mt._M_p._3_1_ = 0;
  rd.field_0._M_mt._M_p._4_4_ = n;
  std::__cxx11::list<cv::Mat,_std::allocator<cv::Mat>_>::list(__return_storage_ptr__);
  std::random_device::random_device((random_device *)local_13a8);
  rVar1 = std::random_device::operator()((random_device *)local_13a8);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)&realgen._M_param._M_b,(ulong)rVar1);
  std::uniform_real_distribution<double>::uniform_real_distribution
            ((uniform_real_distribution<double> *)local_2750,-1.0,1.0);
  for (xangl._4_4_ = 0; xangl._4_4_ < (int)rd.field_0._M_mt._M_p._4_4_;
      xangl._4_4_ = xangl._4_4_ + 1) {
    rVar1 = std::random_device::operator()((random_device *)local_13a8);
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            *)&realgen._M_param._M_b,(ulong)rVar1);
    rVar2 = std::uniform_real_distribution<double>::operator()
                      ((uniform_real_distribution<double> *)local_2750,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)&realgen._M_param._M_b);
    rVar3 = std::uniform_real_distribution<double>::operator()
                      ((uniform_real_distribution<double> *)local_2750,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)&realgen._M_param._M_b);
    rVar4 = std::uniform_real_distribution<double>::operator()
                      ((uniform_real_distribution<double> *)local_2750,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)&realgen._M_param._M_b);
    cv::Mat::Mat(local_27d0);
    cv::Mat::Mat(local_2830);
    cv::Mat::Mat(local_2890);
    cv::Mat::Mat(local_28f0);
    rotateImage(plate,local_27d0,rVar2 * 25.0,rVar3 * 25.0,rVar4 * 10.0,0.0,0.0,300.0,200.0);
    cv::_InputArray::_InputArray(&local_2908,local_27d0);
    cv::_OutputArray::_OutputArray((_OutputArray *)&local_2920,local_2890);
    cv::cvtColor((cv *)&local_2908,&local_2920,(_OutputArray *)0x6,0,in_R8D);
    cv::_OutputArray::~_OutputArray((_OutputArray *)&local_2920);
    cv::_InputArray::~_InputArray(&local_2908);
    cv::_InputArray::_InputArray(&local_29a8,local_2890);
    cv::boundingRect((_InputArray *)local_2990);
    cv::Mat::operator()((Mat *)(local_2990 + 0x10),(Rect *)local_27d0);
    cv::Mat::operator=(local_28f0,(Mat *)(local_2990 + 0x10));
    cv::Mat::~Mat((Mat *)(local_2990 + 0x10));
    cv::_InputArray::~_InputArray(&local_29a8);
    cv::Mat::Mat(local_2a68,local_28f0);
    clearBg(local_2a08);
    std::__cxx11::list<cv::Mat,_std::allocator<cv::Mat>_>::push_back
              (__return_storage_ptr__,local_2a08);
    cv::Mat::~Mat(local_2a08);
    cv::Mat::~Mat(local_2a68);
    cv::Mat::~Mat(local_28f0);
    cv::Mat::~Mat(local_2890);
    cv::Mat::~Mat(local_2830);
    cv::Mat::~Mat(local_27d0);
  }
  rd.field_0._M_mt._M_p._3_1_ = 1;
  std::random_device::~random_device((random_device *)local_13a8);
  if ((rd.field_0._M_mt._M_p._3_1_ & 1) == 0) {
    std::__cxx11::list<cv::Mat,_std::allocator<cv::Mat>_>::~list(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

list<cv::Mat> randomWarps(cv::Mat plate, int n) {
    list<cv::Mat> warps;

    random_device rd;  //Will be used to obtain a seed for the random number engine
    mt19937 gen(rd());
    uniform_real_distribution<> realgen(-1.f, 1.f);

    for (int i =0; i<n; i++) {
        gen.seed(rd());
        auto xangl = realgen(gen)*25.;
        auto yangl = realgen(gen)*25.;
        auto zangl = realgen(gen)*10.;
        cv::Mat platew, respl, grey, res;
        rotateImage(plate, platew, xangl, yangl,zangl, 0,0,300, 200);
        cv::cvtColor(platew, grey, cv::COLOR_BGR2GRAY);
        res = platew(cv::boundingRect(grey));
        warps.push_back(clearBg(res));
    }
    return warps; 
}